

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_unnest.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalUnnest *op)

{
  reference this_00;
  type op_00;
  PhysicalOperator *pPVar1;
  PhysicalOperator *pPVar2;
  reference_wrapper<duckdb::PhysicalOperator> local_20;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&(op->super_LogicalOperator).children,0);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(this_00);
  pPVar1 = CreatePlan(this,op_00);
  pPVar2 = Make<duckdb::PhysicalUnnest,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                     (this,&(op->super_LogicalOperator).types,
                      &(op->super_LogicalOperator).expressions,
                      &(op->super_LogicalOperator).estimated_cardinality);
  local_20._M_data = pPVar1;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&pPVar2->children,&local_20);
  return pPVar2;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalUnnest &op) {
	D_ASSERT(op.children.size() == 1);
	auto &plan = CreatePlan(*op.children[0]);
	auto &unnest = Make<PhysicalUnnest>(op.types, std::move(op.expressions), op.estimated_cardinality);
	unnest.children.push_back(plan);
	return unnest;
}